

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockmanager_args.cpp
# Opt level: O2

Result<void> *
node::ApplyArgsManOptions(Result<void> *__return_storage_ptr__,ArgsManager *args,Options *opts)

{
  optional<bool> oVar1;
  int64_t iVar2;
  bilingual_str *this;
  uint64_t uVar3;
  long in_FS_OFFSET;
  unsigned_long local_f8;
  bilingual_str local_f0;
  bilingual_str local_b0;
  bilingual_str local_70;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"-blocksxor",(allocator<char> *)&local_f8);
  oVar1 = ArgsManager::GetBoolArg(args,&local_f0.original);
  std::__cxx11::string::~string((string *)&local_f0);
  if (((ushort)oVar1.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool> >> 8 & 1) != 0) {
    opts->use_xor =
         oVar1.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>.
         _M_payload;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"-prune",(allocator<char> *)&local_f8);
  iVar2 = ArgsManager::GetIntArg(args,&local_f0.original,opts->prune_target);
  std::__cxx11::string::~string((string *)&local_f0);
  if (iVar2 < 0) {
    _(&local_70,(ConstevalStringLiteral)0x6a186c);
    std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
    _Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
               &local_70);
    this = &local_70;
LAB_001db37e:
    bilingual_str::~bilingual_str(this);
  }
  else {
    if (iVar2 == 1) {
      uVar3 = 0xffffffffffffffff;
    }
    else {
      uVar3 = iVar2 * 0x100000;
      if (uVar3 - 1 < 0x225fffff) {
        _(&local_f0,(ConstevalStringLiteral)0x6a189e);
        local_f8 = 0x226;
        tinyformat::format<unsigned_long>(&local_b0,&local_f0,&local_f8);
        std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
        _Variant_storage<0ul,bilingual_str>
                  ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
                   &local_b0);
        bilingual_str::~bilingual_str(&local_b0);
        this = &local_f0;
        goto LAB_001db37e;
      }
    }
    opts->prune_target = uVar3;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"-fastprune",(allocator<char> *)&local_f8);
    oVar1 = ArgsManager::GetBoolArg(args,&local_f0.original);
    std::__cxx11::string::~string((string *)&local_f0);
    if (((ushort)oVar1.super__Optional_base<bool,_true,_true>._M_payload.
                 super__Optional_payload_base<bool> >> 8 & 1) != 0) {
      opts->fast_prune =
           oVar1.super__Optional_base<bool,_true,_true>._M_payload.
           super__Optional_payload_base<bool>._M_payload;
    }
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\x01';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<void> ApplyArgsManOptions(const ArgsManager& args, BlockManager::Options& opts)
{
    if (auto value{args.GetBoolArg("-blocksxor")}) opts.use_xor = *value;
    // block pruning; get the amount of disk space (in MiB) to allot for block & undo files
    int64_t nPruneArg{args.GetIntArg("-prune", opts.prune_target)};
    if (nPruneArg < 0) {
        return util::Error{_("Prune cannot be configured with a negative value.")};
    }
    uint64_t nPruneTarget{uint64_t(nPruneArg) * 1024 * 1024};
    if (nPruneArg == 1) { // manual pruning: -prune=1
        nPruneTarget = BlockManager::PRUNE_TARGET_MANUAL;
    } else if (nPruneTarget) {
        if (nPruneTarget < MIN_DISK_SPACE_FOR_BLOCK_FILES) {
            return util::Error{strprintf(_("Prune configured below the minimum of %d MiB.  Please use a higher number."), MIN_DISK_SPACE_FOR_BLOCK_FILES / 1024 / 1024)};
        }
    }
    opts.prune_target = nPruneTarget;

    if (auto value{args.GetBoolArg("-fastprune")}) opts.fast_prune = *value;

    return {};
}